

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_shutdown.c
# Opt level: O2

void routine2(void *arg)

{
  FILE *__stream;
  int line;
  uint uVar1;
  int iVar2;
  void *__s2;
  uint *puVar3;
  char *pcVar4;
  char *in_RCX;
  int in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  undefined8 extraout_RDX_01;
  int iVar6;
  bool bVar7;
  
  line = test_socket_impl((char *)0x3e,0x51,in_EDX,(int)in_RCX);
  iVar6 = 10;
  uVar5 = extraout_RDX;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    test_connect_impl((char *)0x41,line,(int)uVar5,in_RCX);
    uVar5 = extraout_RDX_00;
  }
  iVar6 = 10;
  while( true ) {
    bVar7 = iVar6 == 0;
    iVar6 = iVar6 + -1;
    if (bVar7) {
      test_close_impl((char *)0x48,line,(int)uVar5);
      active = active + -1;
      return;
    }
    __s2 = malloc(6);
    if (__s2 == (void *)0x0) {
      nn_backtrace_print();
      fprintf(_stderr,"Out of memory (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/testutil.h"
              ,0xa2);
      fflush(_stderr);
      nn_err_abort();
    }
    uVar1 = nn_recv(line,__s2,6,0);
    __stream = _stderr;
    if ((int)uVar1 < 0) {
      puVar3 = (uint *)__errno_location();
      pcVar4 = nn_err_strerror(*puVar3);
      fprintf(__stream,"Failed to recv: %s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_shutdown.c"
              ,0x45);
      nn_err_abort();
    }
    if (uVar1 != 5) break;
    iVar2 = bcmp("hello",__s2,5);
    if (iVar2 != 0) {
      fprintf(_stderr,"Received data is wrong (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_shutdown.c"
              ,0x45);
      nn_err_abort();
    }
    free(__s2);
    uVar5 = extraout_RDX_01;
  }
  fprintf(_stderr,"Received data has wrong length: %d != %d (%s:%d)\n",(ulong)uVar1,5,
          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_shutdown.c"
          ,0x45);
  nn_err_abort();
}

Assistant:

static void routine2 (NN_UNUSED void *arg)
{
    int s;
    int i;

    s = test_socket (AF_SP, NN_PULL);

    for (i = 0; i < 10; ++i) {
        test_connect (s, SOCKET_ADDRESS);
    }

    for (i = 0; i < MESSAGES_PER_THREAD; ++i) {
        test_recv (s, "hello");
    }

    test_close (s);
    active --;
}